

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O3

void __thiscall fasttext::FastText::precomputeWordVectors(FastText *this,DenseMatrix *wordVectors)

{
  int32_t iVar1;
  long lVar2;
  real rVar3;
  Vector vec;
  string word;
  Vector local_60;
  string local_50;
  
  Vector::Vector(&local_60,
                 (long)((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->dim);
  DenseMatrix::zero(wordVectors);
  lVar2 = 0;
  while( true ) {
    iVar1 = Dictionary::nwords((this->dict_).
                               super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
    if (iVar1 <= lVar2) break;
    Dictionary::getWord_abi_cxx11_
              (&local_50,
               (this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,(int32_t)lVar2);
    getWordVector(this,&local_60,&local_50);
    rVar3 = Vector::norm(&local_60);
    if (0.0 < rVar3) {
      (*(wordVectors->super_Matrix)._vptr_Matrix[3])
                ((ulong)(uint)(1.0 / rVar3),wordVectors,&local_60,lVar2);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    lVar2 = lVar2 + 1;
  }
  free(local_60.data_.mem_);
  return;
}

Assistant:

void FastText::precomputeWordVectors(DenseMatrix& wordVectors) {
  Vector vec(args_->dim);
  wordVectors.zero();
  for (int32_t i = 0; i < dict_->nwords(); i++) {
    std::string word = dict_->getWord(i);
    getWordVector(vec, word);
    real norm = vec.norm();
    if (norm > 0) {
      wordVectors.addVectorToRow(vec, i, 1.0 / norm);
    }
  }
}